

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O3

void mp::
     WriteAlgCon<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::MutAlgebraicCon,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
               (Writer *w,MutAlgebraicCon *con,VarNamer vnam)

{
  double value;
  long lVar1;
  char *pcVar2;
  size_t index;
  ulong uVar3;
  size_t sVar4;
  BasicProblem<mp::BasicProblemParams<int>_> *pBVar5;
  long lVar6;
  ExprBase nonlinear;
  Buffer<char> *pBVar7;
  double value_00;
  FormatSpec local_48;
  
  pBVar5 = (con->
           super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           ).super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  uVar3 = (ulong)(con->
                 super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                 ).super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  lVar6 = (long)(pBVar5->algebraic_cons_).
                super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
  value = *(double *)(lVar6 + 0x78 + uVar3 * 0x88);
  value_00 = *(double *)(lVar6 + 0x80 + uVar3 * 0x88);
  if ((value_00 < INFINITY) && (-INFINITY < value)) {
    if ((value != value_00) || (NAN(value) || NAN(value_00))) {
      local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
      local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
      local_48.flags_ = 0;
      local_48.precision_ = -1;
      local_48.type_ = '\0';
      fmt::BasicWriter<char>::write_double<double>(w,value,&local_48);
      pBVar7 = w->buffer_;
      sVar4 = pBVar7->size_;
      uVar3 = sVar4 + 4;
      if (pBVar7->capacity_ < uVar3) {
        (**pBVar7->_vptr_Buffer)(pBVar7,uVar3);
        sVar4 = pBVar7->size_;
      }
      builtin_strncpy(pBVar7->ptr_ + sVar4," <= ",4);
      pBVar7->size_ = uVar3;
      pBVar5 = (con->
               super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
               ).super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
      uVar3 = (ulong)(con->
                     super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                     ).super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                     index_;
      lVar6 = (long)(pBVar5->algebraic_cons_).
                    super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  lVar1 = (long)(pBVar5->nonlinear_cons_).
                super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(pBVar5->nonlinear_cons_).
                            super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - lVar1 >> 3)) {
    nonlinear.impl_ = *(Impl **)(lVar1 + uVar3 * 8);
  }
  else {
    nonlinear.impl_ = (Impl *)0x0;
  }
  WriteExpr<mp::internal::ExprTypes,mp::LinearExpr,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
            (w,(LinearExpr *)(uVar3 * 0x88 + lVar6),
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)nonlinear.impl_,vnam);
  if ((value != value_00) || (NAN(value) || NAN(value_00))) {
    if (value_00 < INFINITY) {
      pBVar7 = w->buffer_;
      sVar4 = pBVar7->size_;
      uVar3 = sVar4 + 4;
      if (pBVar7->capacity_ < uVar3) {
        (**pBVar7->_vptr_Buffer)(pBVar7,uVar3);
        sVar4 = pBVar7->size_;
      }
      builtin_strncpy(pBVar7->ptr_ + sVar4," <= ",4);
      pBVar7->size_ = uVar3;
      goto LAB_00332f8e;
    }
    if (value <= -INFINITY) {
      return;
    }
    pBVar7 = w->buffer_;
    sVar4 = pBVar7->size_;
    uVar3 = sVar4 + 4;
    if (pBVar7->capacity_ < uVar3) {
      (**pBVar7->_vptr_Buffer)(pBVar7,uVar3);
      sVar4 = pBVar7->size_;
    }
    builtin_strncpy(pBVar7->ptr_ + sVar4," >= ",4);
  }
  else {
    pBVar7 = w->buffer_;
    sVar4 = pBVar7->size_;
    uVar3 = sVar4 + 3;
    if (pBVar7->capacity_ < uVar3) {
      (**pBVar7->_vptr_Buffer)(pBVar7,uVar3);
      sVar4 = pBVar7->size_;
    }
    pcVar2 = pBVar7->ptr_;
    pcVar2[sVar4 + 2] = ' ';
    pcVar2 = pcVar2 + sVar4;
    pcVar2[0] = ' ';
    pcVar2[1] = '=';
  }
  pBVar7->size_ = uVar3;
  value_00 = value;
LAB_00332f8e:
  local_48.type_ = '\0';
  local_48.precision_ = -1;
  local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
  local_48.flags_ = 0;
  local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
  local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
  fmt::BasicWriter<char>::write_double<double>(w,value_00,&local_48);
  return;
}

Assistant:

void WriteAlgCon(fmt::Writer &w,
                 const AlgCon &con, VN vnam) {
  double inf = INFINITY;
  double lb = con.lb(), ub = con.ub();
  if (lb != ub && lb != -inf && ub != inf)
    w << lb << " <= ";
  WriteExpr<ExprTypes>(
        w, con.linear_expr(), con.nonlinear_expr(), vnam);
  if (lb == ub)
    w << " = " << lb;
  else if (ub != inf)
    w << " <= " << ub;
  else if (lb != -inf)
    w << " >= " << lb;
}